

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D_adaptive<vector_realloc_shrink_clear<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,
               vector_realloc_shrink_clear<unsigned_char_*,_16U> *buckets)

{
  long lVar1;
  size_t n_00;
  uint16_t uVar2;
  long *__ptr;
  size_t *psVar3;
  uchar **t;
  size_t j;
  long lVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  uchar **t_00;
  uint16_t cache [16];
  
  if (n < 0x10000) {
    msd_D<vector_realloc_shrink_clear<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  t_00 = strings;
  for (uVar5 = 0; uVar5 < (n & 0xfffffffffffffff0); uVar5 = uVar5 + 0x10) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar2 = get_char<unsigned_short>(t_00[lVar4],depth);
      cache[lVar4] = uVar2;
    }
    t = t_00;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      vector_realloc_shrink_clear<unsigned_char_*,_16U>::push_back(buckets + cache[lVar4],t);
      t = t + 1;
    }
    t_00 = t_00 + 0x10;
  }
  for (; uVar5 < n; uVar5 = uVar5 + 1) {
    uVar2 = get_char<unsigned_short>(*t_00,depth);
    vector_realloc_shrink_clear<unsigned_char_*,_16U>::push_back(buckets + uVar2,t_00);
    t_00 = t_00 + 1;
  }
  psVar3 = &buckets->_size;
  for (lVar4 = 0; lVar4 != 0x10000; lVar4 = lVar4 + 1) {
    __ptr[lVar4] = *psVar3;
    psVar3 = psVar3 + 3;
  }
  psVar3 = &buckets->_size;
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 0x10000; lVar4 = lVar4 + 1) {
    lVar1 = __ptr[lVar4];
    if (lVar1 != 0) {
      if (*psVar3 != 0) {
        memmove(strings + lVar6,
                ((vector_realloc_shrink_clear<unsigned_char_*,_16U> *)(psVar3 + -1))->_data,
                *psVar3 << 3);
      }
      lVar6 = lVar6 + lVar1;
    }
    psVar3 = psVar3 + 3;
  }
  for (lVar4 = 0; lVar4 != 0x180000; lVar4 = lVar4 + 0x18) {
    vector_realloc_shrink_clear<unsigned_char_*,_16U>::clear
              ((vector_realloc_shrink_clear<unsigned_char_*,_16U> *)((long)&buckets->_data + lVar4))
    ;
  }
  lVar4 = *__ptr;
  for (lVar6 = 1; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
    n_00 = __ptr[lVar6];
    if (n_00 != 0) {
      if ((char)lVar6 != '\0') {
        msd_D_adaptive<vector_realloc_shrink_clear<unsigned_char*,16u>>
                  (strings + lVar4,n_00,depth + 2,buckets);
      }
      lVar4 = lVar4 + n_00;
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}